

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua.c
# Opt level: O1

void doREPL(lua_State *L)

{
  bool bVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  int status;
  undefined8 uVar5;
  char *pcVar6;
  size_t sVar7;
  long lVar8;
  char *pcVar9;
  undefined8 local_40;
  ulong local_38;
  
  pcVar2 = progname;
  progname = (char *)0x0;
  do {
    lua_settop(L,0);
    iVar3 = pushline(L,1);
    status = -1;
    if (iVar3 != 0) {
      uVar5 = lua_tolstring(L,0xffffffff,0);
      pcVar6 = (char *)lua_pushfstring(L,"return %s;",uVar5);
      sVar7 = strlen(pcVar6);
      iVar3 = luaL_loadbufferx(L,pcVar6,sVar7,"=stdin",0);
      if (iVar3 == 0) {
        lua_rotate(L,0xfffffffe,0xffffffff);
        lua_settop(L,0xfffffffe);
        status = 0;
      }
      else {
        lua_settop(L,0xfffffffd);
        do {
          uVar5 = lua_tolstring(L,1,&local_40);
          bVar1 = false;
          uVar4 = luaL_loadbufferx(L,uVar5,local_40,"=stdin",0);
          pcVar9 = (char *)(ulong)uVar4;
          if (uVar4 == 3) {
            lVar8 = lua_tolstring(L,0xffffffff,&local_38);
            if ((local_38 < 5) ||
               (iVar3 = strcmp((char *)(lVar8 + -5 + local_38),"<eof>"), iVar3 != 0)) {
              bVar1 = false;
            }
            else {
              lua_settop(L);
              bVar1 = false;
              iVar3 = pushline(L,0);
              if (iVar3 != 0) {
                lua_pushstring(L,"\n");
                lua_rotate(L,0xfffffffe,1);
                lua_concat(L,3);
                bVar1 = true;
                pcVar9 = (char *)((ulong)pcVar6 & 0xffffffff);
              }
            }
          }
          pcVar6 = pcVar9;
          status = (int)pcVar6;
        } while (bVar1);
      }
      lua_rotate(L,1,0xffffffff);
      lua_settop(L);
      iVar3 = lua_gettop(L);
      if (iVar3 != 1) {
        __assert_fail("lua_gettop(L) == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lua.c"
                      ,0x182,"int loadline(lua_State *)");
      }
    }
    if (status == 0) {
      status = docall(L,0,-1);
    }
    else if (status == -1) {
      lua_settop(L,0);
      ravi_writeline(L);
      progname = pcVar2;
      return;
    }
    if (status == 0) {
      iVar3 = lua_gettop();
      if (0 < iVar3) {
        luaL_checkstack(L,0x14,"too many results to print");
        lua_getglobal(L,"print");
        lua_rotate(L,1,1);
        iVar3 = lua_pcallk(L,iVar3,0,0,0,0);
        pcVar6 = progname;
        if (iVar3 != 0) {
          uVar5 = lua_tolstring(L,0xffffffff,0);
          pcVar9 = (char *)lua_pushfstring(L,"error calling \'print\' (%s)",uVar5);
          l_message(L,pcVar6,pcVar9);
        }
      }
    }
    else {
      report(L,status);
    }
  } while( true );
}

Assistant:

static void doREPL (lua_State *L) {
  int status;
  const char *oldprogname = progname;
  progname = NULL;  /* no 'progname' on errors in interactive mode */
  while ((status = loadline(L)) != -1) {
    if (status == LUA_OK)
      status = docall(L, 0, LUA_MULTRET);
    if (status == LUA_OK) l_print(L);
    else report(L, status);
  }
  lua_settop(L, 0);  /* clear stack */
  lua_writeline();
  progname = oldprogname;
}